

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
HdlcSimulationDataGenerator::TransmitByteAsync
          (HdlcSimulationDataGenerator *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  pointer puVar1;
  bool bVar2;
  U8 value;
  int iVar3;
  uint uVar4;
  
  CreateAsyncByte(this,'~');
  bVar2 = ContainsElement(this,this->mFrameNumber);
  uVar4 = 0;
  while( true ) {
    puVar1 = (stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) <= (ulong)uVar4) {
      CreateAsyncByte(this,'~');
      return;
    }
    if (uVar4 == this->mAbortByte && bVar2) break;
    value = puVar1[uVar4];
    if ((byte)(value + 0x83) < 2) {
      CreateAsyncByte(this,'}');
      value = HdlcAnalyzerSettings::Bit5Inv(value);
    }
    CreateAsyncByte(this,value);
    iVar3 = rand();
    AsyncByteFill(this,iVar3 % 8);
    uVar4 = uVar4 + 1;
  }
  CreateAsyncByte(this,'}');
  CreateAsyncByte(this,'~');
  AsyncByteFill(this,7);
  this->mAbortByte = this->mAbortByte + 1;
  return;
}

Assistant:

void HdlcSimulationDataGenerator::TransmitByteAsync( const vector<U8>& stream )
{
    // Opening flag
    CreateAsyncByte( HDLC_FLAG_VALUE );

    bool abortFrame = ContainsElement( mFrameNumber );

    for( U32 i = 0; i < stream.size(); ++i )
    {
        bool abortThisByte = ( mAbortByte == i );
        if( abortFrame && abortThisByte ) // Abort the frame: ABORT SEQUENCE = ESCAPE + FLAG
        {
            CreateAsyncByte( HDLC_ESCAPE_SEQ_VALUE );
            CreateAsyncByte( HDLC_FLAG_VALUE );
            AsyncByteFill( 7 );
            mAbortByte++;
            return;
        }

        const U8 byte = stream[ i ];
        switch( byte )
        {
        case HDLC_FLAG_VALUE:                                                    // 0x7E
            CreateAsyncByte( HDLC_ESCAPE_SEQ_VALUE );                            // 7D escape
            CreateAsyncByte( HdlcAnalyzerSettings::Bit5Inv( HDLC_FLAG_VALUE ) ); // 5E
            break;
        case HDLC_ESCAPE_SEQ_VALUE:                                                    // 0x7D
            CreateAsyncByte( HDLC_ESCAPE_SEQ_VALUE );                                  // 7D escape
            CreateAsyncByte( HdlcAnalyzerSettings::Bit5Inv( HDLC_ESCAPE_SEQ_VALUE ) ); // 5D
            break;
        default:
            CreateAsyncByte( byte ); // normal byte
        }

        // Fill between bytes (0 to 7 bits of value 1)
        AsyncByteFill( rand() % 8 );
    }

    // Closing flag
    CreateAsyncByte( HDLC_FLAG_VALUE );
}